

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

void xmlDumpEntityDecl(xmlBufferPtr buf,xmlEntityPtr ent)

{
  xmlEntityPtr ent_local;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (ent != (xmlEntityPtr)0x0)) {
    switch(ent->etype) {
    case XML_INTERNAL_GENERAL_ENTITY:
      xmlBufferWriteChar(buf,"<!ENTITY ");
      xmlBufferWriteCHAR(buf,ent->name);
      xmlBufferWriteChar(buf," ");
      if (ent->orig == (xmlChar *)0x0) {
        xmlDumpEntityContent(buf,ent->content);
      }
      else {
        xmlBufferWriteQuotedString(buf,ent->orig);
      }
      xmlBufferWriteChar(buf,">\n");
      break;
    case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
      xmlBufferWriteChar(buf,"<!ENTITY ");
      xmlBufferWriteCHAR(buf,ent->name);
      if (ent->ExternalID == (xmlChar *)0x0) {
        xmlBufferWriteChar(buf," SYSTEM ");
        xmlBufferWriteQuotedString(buf,ent->SystemID);
      }
      else {
        xmlBufferWriteChar(buf," PUBLIC ");
        xmlBufferWriteQuotedString(buf,ent->ExternalID);
        xmlBufferWriteChar(buf," ");
        xmlBufferWriteQuotedString(buf,ent->SystemID);
      }
      xmlBufferWriteChar(buf,">\n");
      break;
    case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
      xmlBufferWriteChar(buf,"<!ENTITY ");
      xmlBufferWriteCHAR(buf,ent->name);
      if (ent->ExternalID == (xmlChar *)0x0) {
        xmlBufferWriteChar(buf," SYSTEM ");
        xmlBufferWriteQuotedString(buf,ent->SystemID);
      }
      else {
        xmlBufferWriteChar(buf," PUBLIC ");
        xmlBufferWriteQuotedString(buf,ent->ExternalID);
        xmlBufferWriteChar(buf," ");
        xmlBufferWriteQuotedString(buf,ent->SystemID);
      }
      if (ent->content != (xmlChar *)0x0) {
        xmlBufferWriteChar(buf," NDATA ");
        if (ent->orig == (xmlChar *)0x0) {
          xmlBufferWriteCHAR(buf,ent->content);
        }
        else {
          xmlBufferWriteCHAR(buf,ent->orig);
        }
      }
      xmlBufferWriteChar(buf,">\n");
      break;
    case XML_INTERNAL_PARAMETER_ENTITY:
      xmlBufferWriteChar(buf,"<!ENTITY % ");
      xmlBufferWriteCHAR(buf,ent->name);
      xmlBufferWriteChar(buf," ");
      if (ent->orig == (xmlChar *)0x0) {
        xmlDumpEntityContent(buf,ent->content);
      }
      else {
        xmlBufferWriteQuotedString(buf,ent->orig);
      }
      xmlBufferWriteChar(buf,">\n");
      break;
    case XML_EXTERNAL_PARAMETER_ENTITY:
      xmlBufferWriteChar(buf,"<!ENTITY % ");
      xmlBufferWriteCHAR(buf,ent->name);
      if (ent->ExternalID == (xmlChar *)0x0) {
        xmlBufferWriteChar(buf," SYSTEM ");
        xmlBufferWriteQuotedString(buf,ent->SystemID);
      }
      else {
        xmlBufferWriteChar(buf," PUBLIC ");
        xmlBufferWriteQuotedString(buf,ent->ExternalID);
        xmlBufferWriteChar(buf," ");
        xmlBufferWriteQuotedString(buf,ent->SystemID);
      }
      xmlBufferWriteChar(buf,">\n");
      break;
    default:
      xmlEntitiesErr(XML_DTD_UNKNOWN_ENTITY,
                     "xmlDumpEntitiesDecl: internal: unknown type entity type");
    }
  }
  return;
}

Assistant:

void
xmlDumpEntityDecl(xmlBufferPtr buf, xmlEntityPtr ent) {
    if ((buf == NULL) || (ent == NULL)) return;
    switch (ent->etype) {
	case XML_INTERNAL_GENERAL_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    xmlBufferWriteChar(buf, " ");
	    if (ent->orig != NULL)
		xmlBufferWriteQuotedString(buf, ent->orig);
	    else
		xmlDumpEntityContent(buf, ent->content);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    if (ent->ExternalID != NULL) {
		 xmlBufferWriteChar(buf, " PUBLIC ");
		 xmlBufferWriteQuotedString(buf, ent->ExternalID);
		 xmlBufferWriteChar(buf, " ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    } else {
		 xmlBufferWriteChar(buf, " SYSTEM ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    }
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    if (ent->ExternalID != NULL) {
		 xmlBufferWriteChar(buf, " PUBLIC ");
		 xmlBufferWriteQuotedString(buf, ent->ExternalID);
		 xmlBufferWriteChar(buf, " ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    } else {
		 xmlBufferWriteChar(buf, " SYSTEM ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    }
	    if (ent->content != NULL) { /* Should be true ! */
		xmlBufferWriteChar(buf, " NDATA ");
		if (ent->orig != NULL)
		    xmlBufferWriteCHAR(buf, ent->orig);
		else
		    xmlBufferWriteCHAR(buf, ent->content);
	    }
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_INTERNAL_PARAMETER_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY % ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    xmlBufferWriteChar(buf, " ");
	    if (ent->orig == NULL)
		xmlDumpEntityContent(buf, ent->content);
	    else
		xmlBufferWriteQuotedString(buf, ent->orig);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_EXTERNAL_PARAMETER_ENTITY:
	    xmlBufferWriteChar(buf, "<!ENTITY % ");
	    xmlBufferWriteCHAR(buf, ent->name);
	    if (ent->ExternalID != NULL) {
		 xmlBufferWriteChar(buf, " PUBLIC ");
		 xmlBufferWriteQuotedString(buf, ent->ExternalID);
		 xmlBufferWriteChar(buf, " ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    } else {
		 xmlBufferWriteChar(buf, " SYSTEM ");
		 xmlBufferWriteQuotedString(buf, ent->SystemID);
	    }
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	default:
	    xmlEntitiesErr(XML_DTD_UNKNOWN_ENTITY,
		"xmlDumpEntitiesDecl: internal: unknown type entity type");
    }
}